

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::LoadConstantLayerParams::LoadConstantLayerParams
          (LoadConstantLayerParams *this,LoadConstantLayerParams *from)

{
  void *pvVar1;
  WeightParams *from_00;
  WeightParams *this_00;
  
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__LoadConstantLayerParams_00343b68
  ;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
  .ptr_ = (void *)0x0;
  google::protobuf::RepeatedField<unsigned_long>::RepeatedField(&this->shape_,&from->shape_);
  this->_cached_size_ = 0;
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  from_00 = from->data_;
  if (from_00 == (WeightParams *)0x0 ||
      from == (LoadConstantLayerParams *)&_LoadConstantLayerParams_default_instance_) {
    this_00 = (WeightParams *)0x0;
  }
  else {
    this_00 = (WeightParams *)operator_new(0x50);
    WeightParams::WeightParams(this_00,from_00);
  }
  this->data_ = this_00;
  return;
}

Assistant:

LoadConstantLayerParams::LoadConstantLayerParams(const LoadConstantLayerParams& from)
  : ::google::protobuf::MessageLite(),
      _internal_metadata_(NULL),
      shape_(from.shape_),
      _cached_size_(0) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  if (from.has_data()) {
    data_ = new ::CoreML::Specification::WeightParams(*from.data_);
  } else {
    data_ = NULL;
  }
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.LoadConstantLayerParams)
}